

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::to_string_abi_cxx11_(lest *this,double value)

{
  lest local_38 [32];
  double local_18;
  double value_local;
  
  local_18 = value;
  value_local = (double)this;
  make_value_string<double>(local_38,&local_18);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

inline std::string to_string(         double        value ) { return make_value_string( value ) ;             }